

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteInitDecl(CWriter *this)

{
  bool bVar1;
  string *args;
  string_view module_name;
  undefined1 auVar2 [16];
  Newline local_81;
  undefined1 local_80 [16];
  string local_70;
  reference local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *import_module_name;
  iterator __end2;
  iterator __begin2;
  SymbolSet *__range2;
  CWriter *local_10;
  CWriter *this_local;
  
  args = &this->module_prefix_;
  local_10 = this;
  (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
            ((string *)&__range2,(CWriter *)this);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[6],char_const(&)[8],std::__cxx11::string&,char_const(&)[14],std::__cxx11::string,char_const(&)[2]>
            ((CWriter *)this,(char (*) [6])"void ",(char (*) [8])"wasm2c_",args,
             (char (*) [14])"_instantiate(",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
             (char (*) [2])0x23cdd2);
  std::__cxx11::string::~string((string *)&__range2);
  __end2 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->import_module_set_);
  import_module_name =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->import_module_set_);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&import_module_name);
    if (!bVar1) break;
    local_50 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    module_name._M_len = auVar2._8_8_;
    module_name._M_str = (char *)args;
    local_80 = auVar2;
    (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
              (&local_70,auVar2._0_8_,module_name);
    args = (string *)0x23cdd2;
    (anonymous_namespace)::CWriter::Write<char_const(&)[10],std::__cxx11::string,char_const(&)[2]>
              ((CWriter *)this,(char (*) [10])", struct ",&local_70,(char (*) [2])0x23cdd2);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [3])0x239d95,&local_81);
  return;
}

Assistant:

void CWriter::WriteInitDecl() {
  Write("void ", kAdminSymbolPrefix, module_prefix_, "_instantiate(",
        ModuleInstanceTypeName(), "*");
  for (const auto& import_module_name : import_module_set_) {
    Write(", struct ", ModuleInstanceTypeName(import_module_name), "*");
  }
  Write(");", Newline());
}